

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::utils::RateLimiter_testRateLimiter_Test::RateLimiter_testRateLimiter_Test
          (RateLimiter_testRateLimiter_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00222758;
  return;
}

Assistant:

TEST(RateLimiter, testRateLimiter)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(2, 2);

    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(250);
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(750);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::seconds(5);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
}